

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QString>>>::
     call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>
               (QPromise<QList<QString>_> *promise,QPromiseResolve<QList<QString>_> *resolve,
               QPromiseReject<QList<QString>_> *reject)

{
  QSharedData *pQVar1;
  PromiseData<QList<QString>_> *this;
  PromiseData<QList<QString>_> *this_00;
  anon_class_24_3_5928a092 callback;
  bool bVar2;
  QPromiseBase<void> local_80;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data> local_70;
  undefined **local_68;
  PromiseData<QList<QString>_> *local_60;
  anon_class_24_2_d74e9aa7 local_58;
  QPromise<QList<QString>_> *local_40;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data> *pQStack_38
  ;
  anon_class_24_2_d74e9aa7 *local_30;
  
  this = (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
  bVar2 = PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::isPending
                    (&this->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  this_00 = (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
  if ((!bVar2) &&
     ((this->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_error.m_data.
      _M_exception_object == (void *)0x0)) {
    PromiseResolver<QList<QString>>::resolve<QtPromisePrivate::PromiseValue<QList<QString>>const&>
              ((PromiseResolver<QList<QString>> *)resolve,&this_00->m_value);
    return;
  }
  bVar2 = PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::isPending
                    (&this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)
  ;
  if ((!bVar2) &&
     ((this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_error.m_data
      ._M_exception_object != (void *)0x0)) {
    PromiseResolver<QList<QString>>::reject<QtPromisePrivate::PromiseError_const&>
              ((PromiseResolver<QList<QString>> *)reject,
               &(((promise->super_QPromiseBase<QList<QString>_>).m_d.d)->
                super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_error);
    return;
  }
  local_70.d = (resolve->m_resolver).m_d.d;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_60 = (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
  if (local_60 != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &(local_60->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = &PTR__QPromiseBase_00154470;
  local_58.reject.m_resolver.m_d.d = (PromiseResolver<QList<QString>_>)(reject->m_resolver).m_d.d;
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>)0x0) {
    LOCK();
    (((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d =
       (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
  if (local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d !=
      (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d)->
              super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_30 = &local_58;
  local_58.promise.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00154470;
  pQStack_38 = &local_70;
  callback.fulfilled = (anon_class_24_2_e6a34898 *)pQStack_38;
  callback.this = &promise->super_QPromiseBase<QList<QString>_>;
  callback.rejected = local_30;
  local_40 = promise;
  QtPromise::QPromiseBase<void>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            (&local_80,callback);
  local_80._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001541f0;
  bVar2 = PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::isPending
                    (&((promise->super_QPromiseBase<QList<QString>_>).m_d.d)->
                      super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  if (!bVar2) {
    PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::dispatch
              (&((promise->super_QPromiseBase<QList<QString>_>).m_d.d)->
                super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  }
  local_80._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00154238;
  if (local_80.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_80.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_80.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_80.m_d.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])();
    }
  }
  local_58.promise.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00154070;
  if (local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d !=
      (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d)->
              super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d !=
        (PromiseData<QList<QString>_> *)0x0)) {
      (*((local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d)->
        super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>)0x0) {
    LOCK();
    (((QSharedData *)local_58.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QSharedData *)local_58.reject.m_resolver.m_d.d)->ref).
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(((QSharedData *)local_58.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      operator_delete((void *)local_58.reject.m_resolver.m_d.d,0x10);
    }
  }
  local_68 = &PTR__QPromiseBase_00154070;
  if (local_60 != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &(local_60->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_60 != (PromiseData<QList<QString>_> *)0x0)) {
      (*(local_60->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_70.d,0x10);
    }
  }
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }